

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void errline(int n,int k,FILE *err)

{
  size_t sVar1;
  char *__format;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  
  if (*g_argv != (char *)0x0) {
    fputs(*g_argv,(FILE *)err);
  }
  sVar1 = strlen(*g_argv);
  iVar5 = (int)sVar1 + 1;
  uVar3 = 1;
  if (1 < n) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (g_argv[uVar2] == (char *)0x0) break;
      fprintf((FILE *)err," %s");
      sVar1 = strlen(g_argv[uVar2]);
      iVar5 = iVar5 + (int)sVar1 + 1;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)(uint)n;
    } while ((uint)n != uVar2);
  }
  uVar6 = iVar5 + k;
  if (g_argv[uVar3 & 0xffffffff] != (char *)0x0) {
    lVar4 = (uVar3 & 0xffffffff) * 8;
    do {
      lVar4 = lVar4 + 8;
      fprintf((FILE *)err," %s");
    } while (*(long *)((long)g_argv + lVar4) != 0);
  }
  if ((int)uVar6 < 0x14) {
    __format = "\n%*s^-- here\n";
  }
  else {
    uVar6 = uVar6 - 7;
    __format = "\n%*shere --^\n";
  }
  fprintf((FILE *)err,__format,(ulong)uVar6,"");
  return;
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int spcnt, i;
  if( g_argv[0] ) fprintf(err,"%s",g_argv[0]);
  spcnt = lemonStrlen(g_argv[0]) + 1;
  for(i=1; i<n && g_argv[i]; i++){
    fprintf(err," %s",g_argv[i]);
    spcnt += lemonStrlen(g_argv[i])+1;
  }
  spcnt += k;
  for(; g_argv[i]; i++) fprintf(err," %s",g_argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",spcnt-7,"");
  }
}